

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O1

void skipnl(Global *global)

{
  uint uVar1;
  
  do {
    uVar1 = get(global);
    if ((char)uVar1 == '\n') {
      return;
    }
  } while ((uVar1 & 0xff) != 0);
  return;
}

Assistant:

void skipnl(struct Global *global)
{
  /*
   * Skip to the end of the current input line.
   */
  int c;
  
  do {				/* Skip to newline	*/
    c = get(global);
  } while (c != '\n' && c != EOF_CHAR);
  return;
}